

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.h
# Opt level: O0

void anurbs::Interval::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Interval> *pcVar1;
  arg aVar2;
  undefined1 local_160;
  arg local_158;
  code *local_148;
  undefined8 local_140;
  arg local_138;
  arg local_128;
  code *local_118;
  undefined8 local_110;
  offset_in_Interval_to_subr local_100 [2];
  arg local_f0;
  arg local_e0;
  code *local_d0;
  undefined8 local_c8;
  code *local_c0;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  constructor<double,_double> local_29;
  PyObject *local_28;
  class_<anurbs::Interval> local_20;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *local_18;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  local_28 = (m->super_object).super_handle.m_ptr;
  local_18 = model;
  model_local = (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)m;
  pybind11::class_<anurbs::Interval>::class_<>(&local_20,(handle)local_28,"Interval");
  pybind11::init<double,double>();
  pcVar1 = pybind11::class_<anurbs::Interval>::def<double,double>(&local_20,&local_29);
  local_50 = t0;
  local_48 = 0;
  local_60 = set_t0;
  local_58 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property<double(anurbs::Interval::*)()const,void(anurbs::Interval::*)(double)>
                     (pcVar1,"t0",(offset_in_Model_to_subr *)&local_50,
                      (offset_in_Model_to_subr *)&local_60);
  local_70 = t1;
  local_68 = 0;
  local_80 = set_t1;
  local_78 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property<double(anurbs::Interval::*)()const,void(anurbs::Interval::*)(double)>
                     (pcVar1,"t1",(offset_in_Model_to_subr *)&local_70,
                      (offset_in_Model_to_subr *)&local_80);
  local_90 = min;
  local_88 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property_readonly<double(anurbs::Interval::*)()const>
                     (pcVar1,"min",(offset_in_Model_to_subr *)&local_90);
  local_a0 = max;
  local_98 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property_readonly<double(anurbs::Interval::*)()const>
                     (pcVar1,"max",(offset_in_Model_to_subr *)&local_a0);
  local_b0 = delta;
  local_a8 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property_readonly<double(anurbs::Interval::*)()const>
                     (pcVar1,"delta",(offset_in_Model_to_subr *)&local_b0);
  local_c0 = length;
  local_b8 = 0;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def_property_readonly<double(anurbs::Interval::*)()const>
                     (pcVar1,"length",(offset_in_Model_to_subr *)&local_c0);
  local_d0 = normalized_at;
  local_c8 = 0;
  local_f0 = pybind11::literals::operator____a("t",1);
  local_e0.name = local_f0.name;
  local_e0._8_1_ = local_f0._8_1_;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def<double(anurbs::Interval::*)(double)const,pybind11::arg>
                     (pcVar1,"normalized_at",(offset_in_Model_to_subr *)&local_d0,&local_e0);
  local_118 = parameter_at_normalized;
  local_110 = 0;
  local_100[0] = pybind11::detail::overload_cast_impl<double_const>::operator()
                           (&pybind11::overload_cast<double_const>,parameter_at_normalized,0);
  local_138 = pybind11::literals::operator____a("t",1);
  local_128.name = local_138.name;
  local_128._8_1_ = local_138._8_1_;
  pcVar1 = pybind11::class_<anurbs::Interval>::
           def<double(anurbs::Interval::*)(double)const,pybind11::arg>
                     (pcVar1,"parameter_at_normalized",local_100,&local_128);
  local_148 = clamp;
  local_140 = 0;
  aVar2 = pybind11::literals::operator____a("t",1);
  local_158.name = aVar2.name;
  local_160 = aVar2._8_1_;
  local_158._8_1_ = local_160;
  pybind11::class_<anurbs::Interval>::def<double(anurbs::Interval::*)(double)const,pybind11::arg>
            (pcVar1,"clamp",(offset_in_Model_to_subr *)&local_148,&local_158);
  pybind11::class_<anurbs::Interval>::~class_(&local_20);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Interval;

        py::class_<Type>(m, "Interval")
            .def(py::init<double, double>())
            .def_property("t0", &Type::t0, &Type::set_t0)
            .def_property("t1", &Type::t1, &Type::set_t1)
            .def_property_readonly("min", &Type::min)
            .def_property_readonly("max", &Type::max)
            .def_property_readonly("delta", &Type::delta)
            .def_property_readonly("length", &Type::length)
            .def("normalized_at", &Type::normalized_at,
                "t"_a)
            .def("parameter_at_normalized", py::overload_cast<const double>(
                &Type::parameter_at_normalized, py::const_), "t"_a)
            .def("clamp", (double (Type::*)(const double) const) &Type::clamp,
                "t"_a)
        ;
    }